

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O1

size_t arbiter::http::anon_unknown_4::headerCb(char *buffer,size_t size,size_t num,Headers *out)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  long lVar2;
  mapped_type *pmVar3;
  string data;
  string key;
  string val;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78;
  char local_70 [16];
  key_type local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_80._M_current = local_70;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,buffer,buffer + size * num);
  local_60._M_dataplus._M_p._0_1_ = 10;
  _Var1 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (local_80,local_80._M_current + local_78,(_Iter_equals_val<const_char>)&local_60
                    );
  local_78 = (long)_Var1._M_current - (long)local_80._M_current;
  *_Var1._M_current = '\0';
  local_60._M_dataplus._M_p._0_1_ = 0xd;
  _Var1 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (local_80,local_80._M_current + local_78,(_Iter_equals_val<const_char>)&local_60
                    );
  local_78 = (long)_Var1._M_current - (long)local_80._M_current;
  *_Var1._M_current = '\0';
  lVar2 = ::std::__cxx11::string::find_first_of((char *)&local_80,0x17a4e5,0);
  if (lVar2 != -1) {
    ::std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_80);
    ::std::__cxx11::string::substr((ulong)local_40,(ulong)&local_80);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)out,&local_60);
    ::std::__cxx11::string::_M_assign((string *)pmVar3);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_));
    }
  }
  if (local_80._M_current != local_70) {
    operator_delete(local_80._M_current);
  }
  return size * num;
}

Assistant:

std::size_t headerCb(
            const char *buffer,
            std::size_t size,
            std::size_t num,
            http::Headers* out)
    {
        const std::size_t fullBytes(size * num);

        std::string data(buffer, fullBytes);
        data.erase(std::remove(data.begin(), data.end(), '\n'), data.end());
        data.erase(std::remove(data.begin(), data.end(), '\r'), data.end());

        const std::size_t split(data.find_first_of(":"));

        // No colon means it isn't a header with data.
        if (split == std::string::npos) return fullBytes;

        const std::string key(data.substr(0, split));
        const std::string val(data.substr(split + 1, data.size()));

        (*out)[key] = val;

        return fullBytes;
    }